

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

bool slang::syntax::CoverageBinInitializerSyntax::isKind(SyntaxKind kind)

{
  bool bVar1;
  
  bVar1 = true;
  if ((((kind != DefaultCoverageBinInitializer) && (kind != ExpressionCoverageBinInitializer)) &&
      (kind != IdWithExprCoverageBinInitializer)) &&
     ((kind != RangeCoverageBinInitializer && (kind != TransListCoverageBinInitializer)))) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool CoverageBinInitializerSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::DefaultCoverageBinInitializer:
        case SyntaxKind::ExpressionCoverageBinInitializer:
        case SyntaxKind::IdWithExprCoverageBinInitializer:
        case SyntaxKind::RangeCoverageBinInitializer:
        case SyntaxKind::TransListCoverageBinInitializer:
            return true;
        default:
            return false;
    }
}